

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CleanUpInlineCaches<false>(FunctionBody *this)

{
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  uint uVar1;
  RootObjectBase *pRVar2;
  bool bVar3;
  PropertyId PVar4;
  uint uVar5;
  uint uVar6;
  void ***pppvVar7;
  InlineCacheAllocator *allocator;
  CacheAllocator *allocator_00;
  Type *pTVar8;
  FunctionCodeGenRuntimeData **ppFVar9;
  FunctionCodeGenRuntimeData *this_00;
  ThreadContext *this_01;
  FunctionBodyPolymorphicInlineCache *pFVar10;
  ThreadContext *threadContext;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_90;
  Type runtimeData_1;
  uint i_2;
  Type *codeGenGetSetRuntimeData;
  FunctionCodeGenRuntimeData *runtimeData;
  ProfileId i_1;
  Type *codeGenRuntimeData;
  IsInstInlineCache *local_48;
  IsInstInlineCache *inlineCache_1;
  uint totalCacheCount;
  uint rootObjectStoreInlineCacheEnd;
  uint rootObjectLoadMethodInlineCacheEnd;
  uint rootObjectLoadInlineCacheEnd;
  RootObjectBase *rootObjectBase;
  InlineCache *inlineCache;
  uint local_18;
  uint plainInlineCacheEnd;
  uint i;
  uint unregisteredInlineCacheCount;
  FunctionBody *this_local;
  
  plainInlineCacheEnd = 0;
  _i = this;
  pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  if (*pppvVar7 != (void **)0x0) {
    local_18 = 0;
    inlineCache._4_4_ = GetRootObjectLoadInlineCacheStart(this);
    for (; local_18 < inlineCache._4_4_; local_18 = local_18 + 1) {
      pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar7)[local_18] != (void *)0x0) {
        pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        rootObjectBase = (RootObjectBase *)(*pppvVar7)[local_18];
        bVar3 = InlineCache::RemoveFromInvalidationList((InlineCache *)rootObjectBase);
        if (bVar3) {
          plainInlineCacheEnd = plainInlineCacheEnd + 1;
        }
        allocator = ScriptContext::GetInlineCacheAllocator
                              ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                               m_scriptContext);
        Memory::
        DeleteObject<Memory::InlineCacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::InlineCache>
                  (allocator,(InlineCache *)rootObjectBase);
      }
    }
    _rootObjectLoadMethodInlineCacheEnd = GetRootObject(this);
    rootObjectStoreInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart(this);
    for (; local_18 < rootObjectStoreInlineCacheEnd; local_18 = local_18 + 1) {
      pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      pRVar2 = _rootObjectLoadMethodInlineCacheEnd;
      if ((*pppvVar7)[local_18] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,local_18);
        uVar5 = RootObjectBase::ReleaseInlineCache(pRVar2,PVar4,false,false,false);
        plainInlineCacheEnd = uVar5 + plainInlineCacheEnd;
      }
    }
    totalCacheCount = GetRootObjectStoreInlineCacheStart(this);
    for (; local_18 < totalCacheCount; local_18 = local_18 + 1) {
      pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      pRVar2 = _rootObjectLoadMethodInlineCacheEnd;
      if ((*pppvVar7)[local_18] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,local_18);
        uVar5 = RootObjectBase::ReleaseInlineCache(pRVar2,PVar4,true,false,false);
        plainInlineCacheEnd = uVar5 + plainInlineCacheEnd;
      }
    }
    inlineCache_1._4_4_ = GetInlineCacheCount(this);
    for (; local_18 < inlineCache_1._4_4_; local_18 = local_18 + 1) {
      pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      pRVar2 = _rootObjectLoadMethodInlineCacheEnd;
      if ((*pppvVar7)[local_18] != (void *)0x0) {
        PVar4 = GetPropertyIdFromCacheId(this,local_18);
        uVar5 = RootObjectBase::ReleaseInlineCache(pRVar2,PVar4,false,true,false);
        plainInlineCacheEnd = uVar5 + plainInlineCacheEnd;
      }
    }
    uVar5 = GetInlineCacheCount(this);
    uVar6 = GetIsInstInlineCacheCount(this);
    inlineCache_1._0_4_ = uVar5 + uVar6;
    for (; local_18 < (uint)inlineCache_1; local_18 = local_18 + 1) {
      pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                           ((WriteBarrierPtr *)&this->inlineCaches);
      if ((*pppvVar7)[local_18] != (void *)0x0) {
        pppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void___
                             ((WriteBarrierPtr *)&this->inlineCaches);
        local_48 = (IsInstInlineCache *)(*pppvVar7)[local_18];
        IsInstInlineCache::Unregister
                  (local_48,(this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)
        ;
        allocator_00 = ScriptContext::GetIsInstInlineCacheAllocator
                                 ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                  m_scriptContext);
        Memory::
        DeleteObject<Memory::CacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::IsInstInlineCache>
                  (allocator_00,local_48);
      }
    }
    codeGenRuntimeData = (Type *)0x0;
    Memory::WriteBarrierPtr<void_*>::operator=(&this->inlineCaches,&codeGenRuntimeData);
  }
  pTVar8 = GetCodeGenRuntimeData(this);
  if (pTVar8 != (Type *)0x0) {
    for (runtimeData._6_2_ = 0; runtimeData._6_2_ < this->profiledCallSiteCount;
        runtimeData._6_2_ = runtimeData._6_2_ + 1) {
      ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)(pTVar8 + runtimeData._6_2_));
      if (*ppFVar9 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = &plainInlineCacheEnd;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_1_>
                  (*ppFVar9,fn_00);
      }
    }
  }
  pTVar8 = GetCodeGenGetSetRuntimeData(this);
  if (pTVar8 != (Type *)0x0) {
    for (runtimeData_1.ptr._4_4_ = 0; uVar1 = runtimeData_1.ptr._4_4_,
        uVar5 = GetInlineCacheCount(this), uVar1 < uVar5;
        runtimeData_1.ptr._4_4_ = runtimeData_1.ptr._4_4_ + 1) {
      Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
                (&local_90,pTVar8 + runtimeData_1.ptr._4_4_);
      ppFVar9 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)&local_90);
      if (*ppFVar9 != (FunctionCodeGenRuntimeData *)0x0) {
        this_00 = Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator->(&local_90);
        fn.this = this;
        fn.unregisteredInlineCacheCount = &plainInlineCacheEnd;
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_2_>
                  (this_00,fn);
      }
    }
  }
  if (plainInlineCacheEnd != 0) {
    this_01 = ScriptContext::GetThreadContext
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    ThreadContext::NotifyInlineCacheBatchUnregistered(this_01,plainInlineCacheEnd);
  }
  while (pFVar10 = GetPolymorphicInlineCachesHead(this),
        pFVar10 != (FunctionBodyPolymorphicInlineCache *)0x0) {
    pFVar10 = GetPolymorphicInlineCachesHead(this);
    FunctionBodyPolymorphicInlineCache::Finalize(pFVar10,false);
  }
  InlineCachePointerArray<Js::PolymorphicInlineCache>::Reset(&this->polymorphicInlineCaches);
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }